

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_connect_hardlink_files(iso9660_conflict *iso9660)

{
  archive_rb_node *paVar1;
  long in_RDI;
  isofile *nf;
  isofile *target;
  hardlink *hl;
  archive_rb_node *n;
  uintptr_t local_28;
  archive_rb_node *local_10;
  
  for (local_10 = __archive_rb_tree_iterate
                            ((archive_rb_tree *)(in_RDI + 0xa8),(archive_rb_node *)0x0,0);
      local_10 != (archive_rb_node *)0x0;
      local_10 = __archive_rb_tree_iterate((archive_rb_tree *)(in_RDI + 0xa8),local_10,1)) {
    paVar1 = local_10[1].rb_nodes[1];
    archive_entry_set_nlink((archive_entry *)paVar1[1].rb_nodes[1],*(uint *)local_10[1].rb_nodes);
    for (local_28 = paVar1->rb_info; local_28 != 0; local_28 = *(uintptr_t *)(local_28 + 0x10)) {
      *(archive_rb_node **)(local_28 + 0x18) = paVar1;
      archive_entry_set_nlink(*(archive_entry **)(local_28 + 0x20),*(uint *)local_10[1].rb_nodes);
    }
  }
  return;
}

Assistant:

static void
isofile_connect_hardlink_files(struct iso9660 *iso9660)
{
	struct archive_rb_node *n;
	struct hardlink *hl;
	struct isofile *target, *nf;

	ARCHIVE_RB_TREE_FOREACH(n, &(iso9660->hardlink_rbtree)) {
		hl = (struct hardlink *)n;

		/* The first entry must be a hardlink target. */
		target = hl->file_list.first;
		archive_entry_set_nlink(target->entry, hl->nlink);
		/* Set a hardlink target to reference entries. */
		for (nf = target->hlnext;
		    nf != NULL; nf = nf->hlnext) {
			nf->hardlink_target = target;
			archive_entry_set_nlink(nf->entry, hl->nlink);
		}
	}
}